

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::compile_compute_shader_helper
               (NegativeTestContext *ctx,char **computeShaderSource,GLint *compileStatus)

{
  GLuint shader;
  
  shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x91b9);
  *compileStatus = -1;
  glu::CallLogWrapper::glShaderSource
            (&ctx->super_CallLogWrapper,shader,1,computeShaderSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader);
  glu::CallLogWrapper::glGetShaderiv(&ctx->super_CallLogWrapper,shader,0x8b81,compileStatus);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
  return;
}

Assistant:

void compile_compute_shader_helper (NegativeTestContext& ctx, const char* const* computeShaderSource, GLint* compileStatus)
{
	GLuint shader = ctx.glCreateShader(GL_COMPUTE_SHADER);

	*compileStatus = -1;
	ctx.glShaderSource(shader, 1, computeShaderSource, DE_NULL);
	ctx.glCompileShader(shader);
	ctx.glGetShaderiv(shader, GL_COMPILE_STATUS, compileStatus);
	ctx.glDeleteShader(shader);
}